

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NS.cpp
# Opt level: O1

NS * __thiscall NS::get_all(NS *__return_storage_ptr__,NS *this,Prep preposition)

{
  pointer ppNVar1;
  N *n;
  bool bVar2;
  undefined8 uVar3;
  pointer ppNVar4;
  N *local_38;
  
  (__return_storage_ptr__->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppNVar4 = (this->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppNVar1 = (this->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  while( true ) {
    if (ppNVar4 == ppNVar1) {
      return __return_storage_ptr__;
    }
    n = *ppNVar4;
    local_38 = n;
    if ((preposition->super__Function_base)._M_manager == (_Manager_type)0x0) break;
    bVar2 = (*preposition->_M_invoker)((_Any_data *)preposition,&local_38);
    if (bVar2) {
      add(__return_storage_ptr__,n);
    }
    ppNVar4 = ppNVar4 + 1;
  }
  uVar3 = std::__throw_bad_function_call();
  ppNVar4 = (__return_storage_ptr__->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppNVar4 != (pointer)0x0) {
    operator_delete(ppNVar4,(long)(__return_storage_ptr__->_os).
                                  super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage - (long)ppNVar4);
  }
  _Unwind_Resume(uVar3);
}

Assistant:

NS NS::get_all(Prep preposition) {
    NS res;
    for (auto n : _os) if (preposition(n)) res.add(n);
    return res;
}